

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm.c
# Opt level: O1

gpu_object * nvrm_get_fifo(gpu_object *obj,uint64_t gpu_addr,int strict)

{
  uint32_t uVar1;
  bool bVar2;
  gpu_object *pgVar3;
  int iVar4;
  gpu_object *pgVar5;
  char *__format;
  
  if (obj == (gpu_object *)0x0) {
    return (gpu_object *)0x0;
  }
  pgVar5 = (gpu_object *)0x0;
  do {
    uVar1 = obj->class_;
    pgVar3 = obj;
    if ((uVar1 - 0x406e & 0xfffffbff) == 0) goto LAB_0025275c;
    if ((int)uVar1 < 0xa16f) {
      if ((int)uVar1 < 0x866f) {
        if ((uVar1 != 0x506f) && (uVar1 != 0x826f)) goto LAB_00252759;
      }
      else if ((uVar1 != 0x866f) && ((uVar1 != 0x906f && (uVar1 != 0xa06f)))) goto LAB_00252759;
    }
    else if ((int)uVar1 < 0xc06f) {
      if (((uVar1 != 0xa16f) && (uVar1 != 0xa26f)) && (uVar1 != 0xb06f)) {
LAB_00252759:
        pgVar3 = pgVar5;
      }
    }
    else if (((uVar1 != 0xc06f) && (uVar1 != 0xc36f)) && (uVar1 != 0xc46f)) goto LAB_00252759;
LAB_0025275c:
    pgVar5 = pgVar3;
    iVar4 = is_fifo_and_addr_belongs(obj,gpu_addr);
    if (iVar4 != 0) {
      return obj;
    }
    if (obj->class_ == 0x80) {
      pgVar5 = nvrm_find_object_by_func(obj,is_fifo_and_addr_belongs,gpu_addr);
      if (strict != 0 || pgVar5 != (gpu_object *)0x0) {
        return pgVar5;
      }
      pgVar5 = nvrm_find_object_by_func(obj,is_fifo,0);
      break;
    }
    obj = obj->parent_object;
    if (obj == (gpu_object *)0x0) {
      return pgVar5;
    }
  } while( true );
  while (obj = obj->parent_object, obj != (gpu_object *)0x0) {
    if (obj->class_ == 0x80) goto LAB_002527e9;
  }
  obj = (gpu_object *)0x0;
LAB_002527e9:
  bVar2 = true;
  if ((obj != (gpu_object *)0x0) && (obj->class_data != (void *)0x0)) {
    if (obj->class_ != 0x80) {
      demmt_abort();
    }
    bVar2 = *(int *)((long)obj->class_data + 4) < 2;
  }
  if ((!bVar2) && ((nvrm_get_fifo_warned & 1) == 0)) {
    iVar4 = nvrm_get_chipset(obj);
    if (iVar4 < 0x81 && iVar4 != 0x50) {
      __format = 
      "ERROR: This trace may not be decoded accurately because there are multiple fifo objects and USER buffer detection is not implemented yet%s\n"
      ;
    }
    else {
      __format = 
      "ERROR: This trace may not be decoded accurately because there are multiple fifo objects and ioctl_creates for some of them were not captured with argument data%s\n"
      ;
    }
    fprintf(_stdout,__format,"");
    if (mmt_sync_fd != -1) {
      fflush(_stdout);
    }
    nvrm_get_fifo_warned = 1;
  }
  return pgVar5;
}

Assistant:

struct gpu_object *nvrm_get_fifo(struct gpu_object *obj, uint64_t gpu_addr, int strict)
{
	struct gpu_object *last = NULL;
	while (obj)
	{
		if (is_fifo(obj, 0))
			last = obj;
		if (is_fifo_and_addr_belongs(obj, gpu_addr))
			return obj;
		if (obj->class_ == NVRM_DEVICE_0)
		{
			struct gpu_object *fifo = nvrm_find_object_by_func(obj, is_fifo_and_addr_belongs, gpu_addr);
			if (!fifo && !strict) // fallback, for traces without ioctl_create args
			{
				fifo = nvrm_find_object_by_func(obj, is_fifo, 0);

				struct gpu_object *dev = nvrm_get_device(obj);
				int fifos = 0;
				if (dev && dev->class_data)
					fifos = nvrm_dev(dev)->fifos;

				static int warned = 0;
				if (fifos > 1 && !warned)
				{
					int chipset = nvrm_get_chipset(dev);
					if (chipset > 0x80 || chipset == 0x50)
						mmt_error("This trace may not be decoded accurately because there are multiple fifo objects "
								"and ioctl_creates for some of them were not captured with argument data%s\n", "");
					else
						mmt_error("This trace may not be decoded accurately because there are multiple fifo objects "
								"and USER buffer detection is not implemented yet%s\n", "");
					warned = 1;
				}
			}
			return fifo;
		}

		obj = obj->parent_object;
	}

	return last;
}